

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  int iVar1;
  Expr *pEVar2;
  ulong uVar3;
  int iVar4;
  Expr *z;
  int iValue;
  int local_2c;
  
  local_2c = 0;
  iVar4 = 0;
  if (pToken != (Token *)0x0) {
    if ((op == 0x8f) && (pToken->z != (char *)0x0)) {
      iVar1 = sqlite3GetInt32(pToken->z,&local_2c);
      iVar4 = 0;
      if (iVar1 != 0) goto LAB_00148a50;
    }
    iVar4 = pToken->n + 1;
  }
LAB_00148a50:
  pEVar2 = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar4 + 0x48);
  if (pEVar2 != (Expr *)0x0) {
    pEVar2->op = '\0';
    pEVar2->affinity = '\0';
    *(undefined2 *)&pEVar2->field_0x2 = 0;
    pEVar2->flags = 0;
    (pEVar2->u).zToken = (char *)0x0;
    pEVar2->iColumn = 0;
    pEVar2->iAgg = 0;
    pEVar2->iRightJoinTable = 0;
    pEVar2->op2 = '\0';
    pEVar2->field_0x37 = 0;
    pEVar2->pAggInfo = (AggInfo *)0x0;
    (pEVar2->x).pList = (ExprList *)0x0;
    pEVar2->nHeight = 0;
    pEVar2->iTable = 0;
    pEVar2->pLeft = (Expr *)0x0;
    pEVar2->pRight = (Expr *)0x0;
    (pEVar2->y).pTab = (Table *)0x0;
    pEVar2->op = (u8)op;
    pEVar2->iAgg = -1;
    if (pToken != (Token *)0x0) {
      if (iVar4 == 0) {
        pEVar2->flags = 0x800400;
        (pEVar2->u).iValue = local_2c;
      }
      else {
        z = pEVar2 + 1;
        (pEVar2->u).zToken = (char *)z;
        if ((ulong)pToken->n == 0) {
          uVar3 = 0;
        }
        else {
          memcpy(z,pToken->z,(ulong)pToken->n);
          uVar3 = (ulong)pToken->n;
        }
        (&z->op)[uVar3] = '\0';
        if ((dequote != 0) && ((char)""[z->op] < '\0')) {
          if (z->op == 0x22) {
            pEVar2->flags = 0x40;
          }
          sqlite3Dequote((char *)z);
        }
      }
    }
    pEVar2->nHeight = 1;
  }
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf;
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          if( pNew->u.zToken[0]=='"' ) pNew->flags |= EP_DblQuoted;
          sqlite3Dequote(pNew->u.zToken);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif  
  }
  return pNew;
}